

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

value_type __thiscall djb::sgd::eval(sgd *this,vec3 *wi,vec3 *wo,void *param_3)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  _func_int **pp_Var5;
  float *pfVar6;
  float *pfVar7;
  impl *piVar8;
  vec3 *wi_00;
  float *extraout_RDX;
  float *extraout_RDX_00;
  _func_int **pp_Var9;
  float fVar10;
  float fVar11;
  value_type vVar12;
  vec3 vVar13;
  value_type F;
  value_type D;
  value_type G;
  float local_70;
  vec3 local_60;
  undefined4 uStack_54;
  sgd local_50;
  void *local_38;
  
  if ((wo->z <= 0.0) || (*(float *)((long)param_3 + 8) <= 0.0)) {
    (**(code **)(*(long *)wi + 0x10))(this,wi);
    pfVar6 = extraout_RDX_00;
  }
  else {
    local_60.z = wo->z + *(float *)((long)param_3 + 8);
    local_60.y = wo->y + *(float *)((long)param_3 + 4);
    local_60.x = wo->x + *param_3;
    vVar13 = normalize(&local_60);
    lVar4 = *(long *)&wi[1].y;
    dVar1 = *(double *)(lVar4 + 0x28);
    dVar2 = *(double *)(lVar4 + 0x30);
    dVar3 = *(double *)(lVar4 + 0x38);
    pfVar6 = (float *)operator_new(0xc);
    *pfVar6 = (float)dVar1;
    pfVar6[1] = (float)dVar2;
    pfVar6[2] = (float)dVar3;
    lVar4 = *(long *)&wi[1].y;
    dVar1 = *(double *)(lVar4 + 0x10);
    dVar2 = *(double *)(lVar4 + 0x18);
    dVar3 = *(double *)(lVar4 + 0x20);
    pfVar7 = (float *)operator_new(0xc);
    *pfVar7 = (float)dVar1;
    pfVar7[1] = (float)dVar2;
    pfVar7[2] = (float)dVar3;
    local_70 = vVar13.y;
    fVar10 = vVar13.z * wo->z + wo->x * local_70 + wo->y * vVar13.z;
    fVar11 = 0.0;
    if (0.0 <= fVar10) {
      fVar11 = fVar10;
    }
    fVar10 = 1.0;
    if (fVar11 <= 1.0) {
      fVar10 = fVar11;
    }
    (**(code **)(**(long **)&wi->z + 0x20))(fVar10,&local_60);
    gaf((sgd *)&local_50.m_data,wi,wi_00,wo);
    ndf(&local_50,wi);
    fVar11 = wo->z;
    fVar10 = *(float *)((long)param_3 + 8);
    (this->super_brdf_rgb).super_brdf._vptr_brdf = (_func_int **)0x3;
    piVar8 = (impl *)operator_new(0xc);
    (this->m_fresnel).m_f = piVar8;
    pp_Var5 = (this->super_brdf_rgb).super_brdf._vptr_brdf;
    if (pp_Var5 != (_func_int **)0x0) {
      pp_Var9 = (_func_int **)0x0;
      do {
        *(float *)((long)&piVar8->_vptr_impl + (long)pp_Var9 * 4) =
             ((*(float *)(CONCAT44(uStack_54,local_60.z) + (long)pp_Var9 * 4) *
               *(float *)((long)&(local_50.m_fresnel.m_f)->_vptr_impl + (long)pp_Var9 * 4) *
               *(float *)((long)local_38 + (long)pp_Var9 * 4) * pfVar6[(long)pp_Var9]) /
              (fVar11 * fVar10) + pfVar7[(long)pp_Var9]) / 3.1415927;
        pp_Var9 = (_func_int **)((long)pp_Var9 + 1);
      } while (pp_Var5 != pp_Var9);
    }
    operator_delete(local_50.m_fresnel.m_f);
    operator_delete(local_38);
    operator_delete((void *)CONCAT44(uStack_54,local_60.z));
    operator_delete(pfVar7);
    operator_delete(pfVar6);
    pfVar6 = extraout_RDX;
  }
  vVar12._M_data = pfVar6;
  vVar12._M_size = (size_t)this;
  return vVar12;
}

Assistant:

brdf::value_type
sgd::eval(const vec3 &wi, const vec3 &wo, const void *) const
{
	if (wi.z > 0 && wo.z > 0) {
		vec3 wh = normalize(wi + wo);
		const brdf::value_type Ks = {
		    (float_t)m_data->rhoS[0],
		    (float_t)m_data->rhoS[1],
		    (float_t)m_data->rhoS[2]
		};
		const brdf::value_type Kd = {
		    (float_t)m_data->rhoD[0],
		    (float_t)m_data->rhoD[1],
		    (float_t)m_data->rhoD[2]
		};
		brdf::value_type F = m_fresnel->eval(sat(dot(wi, wh)));
		brdf::value_type G = gaf(wh, wi, wo);
		brdf::value_type D = ndf(wh);

		return ((Kd + Ks * (F * D * G) / (wi.z * wo.z)) / m_pi());
	}

	return zero_value();
}